

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

ScopedStmtBlock * __thiscall
kratos::SwitchStmt::add_switch_case
          (SwitchStmt *this,shared_ptr<kratos::Const> *switch_case,shared_ptr<kratos::Stmt> *stmt)

{
  element_type *peVar1;
  element_type *peVar2;
  long lVar3;
  shared_ptr<kratos::Stmt> *psVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Rb_tree_node_base *p_Var6;
  shared_ptr<kratos::Stmt> *s;
  shared_ptr<kratos::Stmt> *stmt_00;
  undefined1 local_58 [8];
  shared_ptr<kratos::StmtBlock> blk;
  shared_ptr<kratos::ScopedStmtBlock> switch_stmt;
  
  peVar1 = (stmt->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*(peVar1->super_IRNode)._vptr_IRNode[7])(peVar1,this);
  blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  switch_stmt.super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  p_Var6 = (this->body_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  peVar2 = (switch_case->super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  do {
    if ((_Rb_tree_header *)p_Var6 == &(this->body_)._M_t._M_impl.super__Rb_tree_header) {
LAB_001a55a2:
      std::make_shared<kratos::ScopedStmtBlock>();
      std::__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)
                 &blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)local_58);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&blk);
      (*(blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base[7])
                (blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi,this);
      std::
      _Rb_tree<std::shared_ptr<kratos::Const>,std::pair<std::shared_ptr<kratos::Const>const,std::shared_ptr<kratos::ScopedStmtBlock>>,std::_Select1st<std::pair<std::shared_ptr<kratos::Const>const,std::shared_ptr<kratos::ScopedStmtBlock>>>,std::less<std::shared_ptr<kratos::Const>>,std::allocator<std::pair<std::shared_ptr<kratos::Const>const,std::shared_ptr<kratos::ScopedStmtBlock>>>>
      ::
      _M_emplace_unique<std::shared_ptr<kratos::Const>const&,std::shared_ptr<kratos::ScopedStmtBlock>&>
                ((_Rb_tree<std::shared_ptr<kratos::Const>,std::pair<std::shared_ptr<kratos::Const>const,std::shared_ptr<kratos::ScopedStmtBlock>>,std::_Select1st<std::pair<std::shared_ptr<kratos::Const>const,std::shared_ptr<kratos::ScopedStmtBlock>>>,std::less<std::shared_ptr<kratos::Const>>,std::allocator<std::pair<std::shared_ptr<kratos::Const>const,std::shared_ptr<kratos::ScopedStmtBlock>>>>
                  *)&this->body_,switch_case,
                 (shared_ptr<kratos::ScopedStmtBlock> *)
                 &blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
LAB_001a55e1:
      if (((stmt->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type_ ==
          Block) {
        Stmt::as<kratos::StmtBlock>((Stmt *)local_58);
        psVar4 = (((StmtBlock *)local_58)->stmts_).
                 super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (stmt_00 = (((StmtBlock *)local_58)->stmts_).
                       super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; stmt_00 != psVar4;
            stmt_00 = stmt_00 + 1) {
          StmtBlock::add_stmt((StmtBlock *)
                              blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi,stmt_00);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&blk);
      }
      else {
        StmtBlock::add_stmt((StmtBlock *)
                            blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi,stmt);
      }
      _Var5._M_pi = blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&switch_stmt);
      return (ScopedStmtBlock *)_Var5._M_pi;
    }
    lVar3 = *(long *)(p_Var6 + 1);
    if (peVar2 == (element_type *)0x0) {
      if (lVar3 == 0) goto LAB_001a5588;
    }
    else if ((lVar3 != 0) && (*(long *)(lVar3 + 0x270) == peVar2->value_)) {
LAB_001a5588:
      std::__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)
                 &blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)
                 &p_Var6[1]._M_left);
      if (blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_001a55e1;
      goto LAB_001a55a2;
    }
    p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
  } while( true );
}

Assistant:

ScopedStmtBlock &SwitchStmt::add_switch_case(const std::shared_ptr<Const> &switch_case,
                                             const std::shared_ptr<Stmt> &stmt) {
    stmt->set_parent(this);
    std::shared_ptr<ScopedStmtBlock> switch_stmt;
    for (auto const &[c, s] : body_) {
        if ((!switch_case && !c) || (switch_case && c && c->value() == switch_case->value())) {
            switch_stmt = s;
            break;
        }
    }
    if (!switch_stmt) {
        switch_stmt = std::make_shared<ScopedStmtBlock>();
        switch_stmt->set_parent(this);
        body_.emplace(switch_case, switch_stmt);
    }
    if (stmt->type() == StatementType::Block) {
        // merge the block
        auto blk = stmt->as<StmtBlock>();
        for (auto const &s : *blk) {
            switch_stmt->add_stmt(s);
        }
    } else {
        switch_stmt->add_stmt(stmt);
    }
    return *switch_stmt;
}